

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

void __thiscall sophia_interface::debugNonLUND(sophia_interface *this,string *errm,bool stopProgram)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  double dVar3;
  int local_24;
  int local_20;
  int j;
  int i;
  bool stopProgram_local;
  string *errm_local;
  sophia_interface *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"debugNonLUND: ");
  poVar2 = std::operator<<(poVar2,(string *)errm);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"np = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->np);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; local_20 < this->np; local_20 = local_20 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"ID = ");
    iVar1 = ID_sophia_to_PDG(this->LLIST[local_20]);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"|P\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->p[local_24][local_20]);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"test random number: ");
  dVar3 = RNDM(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (stopProgram) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"stopped by debugNonLUND.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void sophia_interface::debugNonLUND(std::string errm, bool stopProgram) {
    std::cout << "------------------------------------" << std::endl;
    std::cout << "debugNonLUND: " << errm << std::endl;
    std::cout << "np = "<< np << std::endl;
    for (int i = 0; i < np; ++i) {
        std::cout << "ID = " << ID_sophia_to_PDG(LLIST[i]) << std::endl;
        for (int j = 0; j < 5; ++j) {
            std::cout << "|P\t" << p[j][i] << std::endl;
        }
    }
    std::cout << "test random number: " << RNDM() << std::endl;
    std::cout << "------------------------------------" << std::endl;
    if (stopProgram) throw std::runtime_error("stopped by debugNonLUND.");
}